

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

int __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::updateRow(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *this,int r,int lv,int prow,int pcol,
           number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *pval,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 eps)

{
  int *piVar1;
  undefined1 uVar2;
  int iVar3;
  int iVar4;
  pointer pnVar5;
  undefined8 uVar6;
  Pring *pPVar7;
  Pring *pPVar8;
  Pring *pPVar9;
  fpclass_type fVar10;
  int32_t iVar11;
  bool bVar12;
  bool bVar13;
  int *piVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int *piVar19;
  int *piVar20;
  long lVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar22;
  cpp_dec_float<200U,_int,_void> *pcVar23;
  uint *puVar24;
  cpp_dec_float<200U,_int,_void> *pcVar25;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar26;
  pointer pnVar27;
  long lVar28;
  long lVar29;
  byte bVar30;
  int local_458;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  uint local_3a8 [30];
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar30 = 0;
  local_3a8[0x18] = 0;
  local_3a8[0x19] = 0;
  local_3a8[0x1a] = 0;
  local_3a8[0x1b] = 0;
  local_3a8[0x14] = 0;
  local_3a8[0x15] = 0;
  local_3a8[0x16] = 0;
  local_3a8[0x17] = 0;
  local_3a8[0x10] = 0;
  local_3a8[0x11] = 0;
  local_3a8[0x12] = 0;
  local_3a8[0x13] = 0;
  local_3a8[0xc] = 0;
  local_3a8[0xd] = 0;
  local_3a8[0xe] = 0;
  local_3a8[0xf] = 0;
  local_3a8[8] = 0;
  local_3a8[9] = 0;
  local_3a8[10] = 0;
  local_3a8[0xb] = 0;
  local_3a8[4] = 0;
  local_3a8[5] = 0;
  local_3a8[6] = 0;
  local_3a8[7] = 0;
  local_3a8[0] = 0;
  local_3a8[1] = 0;
  local_3a8[2] = 0;
  local_3a8[3] = 0;
  piVar14 = (this->u).row.len;
  iVar3 = (this->u).row.start[r];
  iVar18 = piVar14[r];
  piVar14[r] = iVar18 + -1;
  local_458 = iVar18 + -1 + iVar3;
  lVar29 = (long)local_458;
  lVar16 = lVar29 * 4;
  lVar21 = lVar29 * 0x80 + 0x80;
  do {
    lVar28 = lVar21;
    lVar17 = lVar16;
    lVar16 = lVar17 + -4;
    lVar21 = lVar28 + -0x80;
  } while (*(int *)((long)(this->u).row.idx + lVar17) != pcol);
  result_1.m_backend.fpclass = cpp_dec_float_finite;
  result_1.m_backend.prec_elem = 0x1c;
  result_1.m_backend.data._M_elems[0] = 0;
  result_1.m_backend.data._M_elems[1] = 0;
  result_1.m_backend.data._M_elems[2] = 0;
  result_1.m_backend.data._M_elems[3] = 0;
  result_1.m_backend.data._M_elems[4] = 0;
  result_1.m_backend.data._M_elems[5] = 0;
  result_1.m_backend.data._M_elems[6] = 0;
  result_1.m_backend.data._M_elems[7] = 0;
  result_1.m_backend.data._M_elems[8] = 0;
  result_1.m_backend.data._M_elems[9] = 0;
  result_1.m_backend.data._M_elems[10] = 0;
  result_1.m_backend.data._M_elems[0xb] = 0;
  result_1.m_backend.data._M_elems[0xc] = 0;
  result_1.m_backend.data._M_elems[0xd] = 0;
  result_1.m_backend.data._M_elems[0xe] = 0;
  result_1.m_backend.data._M_elems[0xf] = 0;
  result_1.m_backend.data._M_elems[0x10] = 0;
  result_1.m_backend.data._M_elems[0x11] = 0;
  result_1.m_backend.data._M_elems[0x12] = 0;
  result_1.m_backend.data._M_elems[0x13] = 0;
  result_1.m_backend.data._M_elems[0x14] = 0;
  result_1.m_backend.data._M_elems[0x15] = 0;
  result_1.m_backend.data._M_elems[0x16] = 0;
  result_1.m_backend.data._M_elems[0x17] = 0;
  result_1.m_backend.data._M_elems[0x18] = 0;
  result_1.m_backend.data._M_elems[0x19] = 0;
  result_1.m_backend.data._M_elems._104_5_ = 0;
  result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  result_1.m_backend.exp = 0;
  result_1.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
            (&result_1.m_backend,
             (cpp_dec_float<200U,_int,_void> *)
             ((long)(this->u).row.val.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[-1].m_backend.data._M_elems + lVar28),
             &pval->m_backend);
  pcVar23 = &result_1.m_backend;
  pcVar25 = &local_b0;
  for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
    (pcVar25->data)._M_elems[0] = (pcVar23->data)._M_elems[0];
    pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4);
    pcVar25 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar25 + ((ulong)bVar30 * -2 + 1) * 4);
  }
  local_b0.exp = result_1.m_backend.exp;
  local_b0.neg = result_1.m_backend.neg;
  local_b0.fpclass = result_1.m_backend.fpclass;
  local_b0.prec_elem = result_1.m_backend.prec_elem;
  pnVar5 = (this->l).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar23 = &local_b0;
  pnVar27 = pnVar5 + lv;
  for (lVar16 = 0x1c; lVar16 != 0; lVar16 = lVar16 + -1) {
    (pnVar27->m_backend).data._M_elems[0] = (pcVar23->data)._M_elems[0];
    pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + ((ulong)bVar30 * -2 + 1) * 4);
    pnVar27 = (pointer)((long)pnVar27 + ((ulong)bVar30 * -2 + 1) * 4);
  }
  pnVar5[lv].m_backend.exp = result_1.m_backend.exp;
  pnVar5[lv].m_backend.neg = result_1.m_backend.neg;
  pnVar5[lv].m_backend.fpclass = result_1.m_backend.fpclass;
  pnVar5[lv].m_backend.prec_elem = result_1.m_backend.prec_elem;
  (this->l).idx[lv] = r;
  piVar14 = (this->u).row.idx;
  *(int *)((long)piVar14 + lVar17) = piVar14[lVar29];
  pnVar5 = (this->u).row.val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
            ((cpp_dec_float<200U,_int,_void> *)((long)pnVar5[-1].m_backend.data._M_elems + lVar28),
             &pnVar5[lVar29].m_backend);
  iVar18 = (this->u).row.len[prow];
  do {
    piVar14 = (this->temp).s_mark;
    lVar16 = lVar29 << 7;
    do {
      lVar21 = lVar16;
      if (lVar29 <= iVar3) {
        piVar14 = (this->u).row.len;
        local_458 = piVar14[r];
        iVar18 = iVar18 + local_458;
        if ((this->u).row.max[r] < iVar18) {
          remaxRow(this,r,iVar18);
          piVar14 = (this->u).row.len;
        }
        piVar19 = (this->u).row.start;
        local_458 = local_458 + piVar19[r];
        lVar21 = (long)piVar19[prow];
        lVar16 = piVar14[prow] + lVar21;
        while( true ) {
          lVar29 = 0x1c;
          if (lVar16 <= lVar21) break;
          piVar14 = (this->temp).s_mark;
          iVar3 = (this->u).row.idx[lVar21];
          if (piVar14[iVar3] == 0) {
            piVar14[iVar3] = 1;
          }
          else {
            pnVar26 = this->work;
            pnVar22 = pnVar26 + iVar3;
            pcVar23 = &result.m_backend;
            for (lVar17 = lVar29; lVar17 != 0; lVar17 = lVar17 + -1) {
              (pcVar23->data)._M_elems[0] = (pnVar22->m_backend).data._M_elems[0];
              pnVar22 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar22 + ((ulong)bVar30 * -2 + 1) * 4);
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4);
            }
            result.m_backend.exp = pnVar26[iVar3].m_backend.exp;
            result.m_backend.neg = pnVar26[iVar3].m_backend.neg;
            result.m_backend.fpclass = pnVar26[iVar3].m_backend.fpclass;
            result.m_backend.prec_elem = pnVar26[iVar3].m_backend.prec_elem;
            if (result.m_backend.fpclass != cpp_dec_float_finite ||
                result.m_backend.data._M_elems[0] != 0) {
              result.m_backend.neg = (bool)(result.m_backend.neg ^ 1);
            }
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x1c;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems[0xe] = 0;
            result_1.m_backend.data._M_elems[0xf] = 0;
            result_1.m_backend.data._M_elems[0x10] = 0;
            result_1.m_backend.data._M_elems[0x11] = 0;
            result_1.m_backend.data._M_elems[0x12] = 0;
            result_1.m_backend.data._M_elems[0x13] = 0;
            result_1.m_backend.data._M_elems[0x14] = 0;
            result_1.m_backend.data._M_elems[0x15] = 0;
            result_1.m_backend.data._M_elems[0x16] = 0;
            result_1.m_backend.data._M_elems[0x17] = 0;
            result_1.m_backend.data._M_elems[0x18] = 0;
            result_1.m_backend.data._M_elems[0x19] = 0;
            result_1.m_backend.data._M_elems._104_5_ = 0;
            result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (&result_1.m_backend,&result.m_backend,&local_b0);
            bVar12 = result_1.m_backend.neg;
            iVar18 = result_1.m_backend.exp;
            pcVar23 = &result_1.m_backend;
            puVar24 = local_3a8;
            for (lVar17 = lVar29; lVar17 != 0; lVar17 = lVar17 + -1) {
              *puVar24 = (pcVar23->data)._M_elems[0];
              pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4);
              puVar24 = puVar24 + (ulong)bVar30 * -2 + 1;
            }
            fVar10 = result_1.m_backend.fpclass;
            iVar11 = result_1.m_backend.prec_elem;
            puVar24 = local_3a8;
            pnVar26 = &local_2b0;
            for (lVar17 = lVar29; lVar17 != 0; lVar17 = lVar17 + -1) {
              (pnVar26->m_backend).data._M_elems[0] = *puVar24;
              puVar24 = puVar24 + (ulong)bVar30 * -2 + 1;
              pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar26 + ((ulong)bVar30 * -2 + 1) * 4);
            }
            local_2b0.m_backend.exp = result_1.m_backend.exp;
            local_2b0.m_backend.neg = result_1.m_backend.neg;
            local_2b0.m_backend.fpclass = result_1.m_backend.fpclass;
            local_2b0.m_backend.prec_elem = result_1.m_backend.prec_elem;
            puVar24 = (uint *)eps.m_backend.data._M_elems._0_8_;
            pnVar26 = &local_230;
            for (lVar17 = lVar29; lVar17 != 0; lVar17 = lVar17 + -1) {
              (pnVar26->m_backend).data._M_elems[0] = *puVar24;
              puVar24 = puVar24 + (ulong)bVar30 * -2 + 1;
              pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar26 + ((ulong)bVar30 * -2 + 1) * 4);
            }
            local_230.m_backend.exp = *(int *)(eps.m_backend.data._M_elems._0_8_ + 0x70);
            local_230.m_backend.neg = *(bool *)(eps.m_backend.data._M_elems._0_8_ + 0x74);
            local_230.m_backend._120_8_ = *(undefined8 *)(eps.m_backend.data._M_elems._0_8_ + 0x78);
            bVar13 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                               (&local_2b0,&local_230);
            if (bVar13) {
              lVar17 = (long)local_458;
              pnVar5 = (this->u).row.val.
                       super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              puVar24 = local_3a8;
              pnVar27 = pnVar5 + lVar17;
              for (; lVar29 != 0; lVar29 = lVar29 + -1) {
                (pnVar27->m_backend).data._M_elems[0] = *puVar24;
                puVar24 = puVar24 + (ulong)bVar30 * -2 + 1;
                pnVar27 = (pointer)((long)pnVar27 + ((ulong)bVar30 * -2 + 1) * 4);
              }
              pnVar5[lVar17].m_backend.exp = iVar18;
              pnVar5[lVar17].m_backend.neg = bVar12;
              pnVar5[lVar17].m_backend.fpclass = fVar10;
              pnVar5[lVar17].m_backend.prec_elem = iVar11;
              (this->u).row.idx[lVar17] = iVar3;
              piVar14 = (this->u).row.len + r;
              *piVar14 = *piVar14 + 1;
              piVar14 = (this->u).col.len;
              iVar18 = piVar14[iVar3];
              if ((this->u).col.max[iVar3] <= iVar18) {
                remaxCol(this,iVar3,iVar18 + 1);
                piVar14 = (this->u).col.len;
                iVar18 = piVar14[iVar3];
              }
              local_458 = local_458 + 1;
              piVar19 = (this->u).col.idx;
              iVar4 = (this->u).col.start[iVar3];
              piVar14[iVar3] = iVar18 + 1;
              piVar19[(long)iVar18 + (long)iVar4] = r;
              piVar14 = (this->temp).s_cact + iVar3;
              *piVar14 = *piVar14 + 1;
            }
          }
          lVar21 = lVar21 + 1;
        }
        pPVar7 = (this->temp).pivot_row;
        pPVar8 = pPVar7[r].next;
        pPVar9 = pPVar7[r].prev;
        pPVar8->prev = pPVar9;
        pPVar9->next = pPVar8;
        pPVar8 = (this->temp).pivot_rowNZ;
        iVar3 = (this->u).row.len[r];
        pPVar9 = pPVar8[iVar3].next;
        pPVar7[r].next = pPVar9;
        pPVar9->prev = pPVar7 + r;
        pPVar7[r].prev = pPVar8 + iVar3;
        pPVar8[iVar3].next = pPVar7 + r;
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                  (&(this->temp).s_max.
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[r].m_backend,-1);
        return lv + 1;
      }
      iVar4 = (this->u).row.idx[lVar29 + -1];
      lVar29 = lVar29 + -1;
      lVar16 = lVar21 + -0x80;
    } while (piVar14[iVar4] == 0);
    piVar14[iVar4] = 0;
    iVar18 = iVar18 + -1;
    result_1.m_backend.fpclass = cpp_dec_float_finite;
    result_1.m_backend.prec_elem = 0x1c;
    result_1.m_backend.data._M_elems[0] = 0;
    result_1.m_backend.data._M_elems[1] = 0;
    result_1.m_backend.data._M_elems[2] = 0;
    result_1.m_backend.data._M_elems[3] = 0;
    result_1.m_backend.data._M_elems[4] = 0;
    result_1.m_backend.data._M_elems[5] = 0;
    result_1.m_backend.data._M_elems[6] = 0;
    result_1.m_backend.data._M_elems[7] = 0;
    result_1.m_backend.data._M_elems[8] = 0;
    result_1.m_backend.data._M_elems[9] = 0;
    result_1.m_backend.data._M_elems[10] = 0;
    result_1.m_backend.data._M_elems[0xb] = 0;
    result_1.m_backend.data._M_elems[0xc] = 0;
    result_1.m_backend.data._M_elems[0xd] = 0;
    result_1.m_backend.data._M_elems[0xe] = 0;
    result_1.m_backend.data._M_elems[0xf] = 0;
    result_1.m_backend.data._M_elems[0x10] = 0;
    result_1.m_backend.data._M_elems[0x11] = 0;
    result_1.m_backend.data._M_elems[0x12] = 0;
    result_1.m_backend.data._M_elems[0x13] = 0;
    result_1.m_backend.data._M_elems[0x14] = 0;
    result_1.m_backend.data._M_elems[0x15] = 0;
    result_1.m_backend.data._M_elems[0x16] = 0;
    result_1.m_backend.data._M_elems[0x17] = 0;
    result_1.m_backend.data._M_elems[0x18] = 0;
    result_1.m_backend.data._M_elems[0x19] = 0;
    result_1.m_backend.data._M_elems._104_5_ = 0;
    result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result_1.m_backend.exp = 0;
    result_1.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result_1.m_backend,&this->work[iVar4].m_backend,&local_b0);
    pnVar5 = (this->u).row.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pnVar5[-1].m_backend.data._M_elems + lVar21);
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator-=
              (pcVar23,&result_1.m_backend);
    lVar16 = 0x1c;
    puVar24 = local_3a8;
    for (lVar17 = lVar16; lVar17 != 0; lVar17 = lVar17 + -1) {
      *puVar24 = (pcVar23->data)._M_elems[0];
      pcVar23 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar23 + (ulong)bVar30 * -8 + 4);
      puVar24 = puVar24 + (ulong)bVar30 * -2 + 1;
    }
    iVar15 = *(int *)((long)(&pnVar5[-1].m_backend.data + 1) + lVar21);
    uVar2 = *(undefined1 *)((long)(&pnVar5[-1].m_backend.data + 1) + 4U + lVar21);
    uVar6 = *(undefined8 *)((long)(&pnVar5[-1].m_backend.data + 1) + 8U + lVar21);
    puVar24 = local_3a8;
    pnVar26 = &local_130;
    for (lVar17 = lVar16; lVar17 != 0; lVar17 = lVar17 + -1) {
      (pnVar26->m_backend).data._M_elems[0] = *puVar24;
      puVar24 = puVar24 + (ulong)bVar30 * -2 + 1;
      pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar26 + ((ulong)bVar30 * -2 + 1) * 4);
    }
    puVar24 = (uint *)eps.m_backend.data._M_elems._0_8_;
    pnVar26 = &local_1b0;
    local_130.m_backend.exp = iVar15;
    local_130.m_backend.neg = (bool)uVar2;
    local_130.m_backend._120_8_ = uVar6;
    for (; lVar16 != 0; lVar16 = lVar16 + -1) {
      (pnVar26->m_backend).data._M_elems[0] = *puVar24;
      puVar24 = puVar24 + (ulong)bVar30 * -2 + 1;
      pnVar26 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar26 + ((ulong)bVar30 * -2 + 1) * 4);
    }
    local_1b0.m_backend.exp = *(int *)(eps.m_backend.data._M_elems._0_8_ + 0x70);
    local_1b0.m_backend.neg = *(bool *)(eps.m_backend.data._M_elems._0_8_ + 0x74);
    local_1b0.m_backend._120_8_ = *(undefined8 *)(eps.m_backend.data._M_elems._0_8_ + 0x78);
    bVar12 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_130,&local_1b0);
    if (bVar12) {
      piVar14 = (this->u).row.len + r;
      *piVar14 = *piVar14 + -1;
      lVar16 = (long)local_458;
      local_458 = local_458 + -1;
      pnVar5 = (this->u).row.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::operator=
                ((cpp_dec_float<200U,_int,_void> *)
                 ((long)pnVar5[-1].m_backend.data._M_elems + lVar21),&pnVar5[lVar16 + -1].m_backend)
      ;
      piVar14 = (this->u).row.idx;
      piVar14[lVar29] = piVar14[lVar16 + -1];
      piVar14 = (this->temp).s_cact + iVar4;
      *piVar14 = *piVar14 + -1;
      piVar14 = (this->u).col.len;
      iVar15 = piVar14[iVar4] + -1;
      piVar14[iVar4] = iVar15;
      piVar14 = (this->u).col.idx;
      lVar16 = (long)(iVar15 + (this->u).col.start[iVar4]);
      piVar19 = piVar14 + lVar16 + 1;
      do {
        piVar20 = piVar19 + -1;
        piVar1 = piVar19 + -1;
        piVar19 = piVar20;
      } while (*piVar1 != r);
      *piVar20 = piVar14[lVar16];
    }
  } while( true );
}

Assistant:

int CLUFactor<R>::updateRow(int r,
                            int lv,
                            int prow,
                            int pcol,
                            R pval,
                            R eps)
{
   int fill;
   R x, lx;
   int c, i, j, k, ll, m, n;

   n = u.row.start[r];
   m = --(u.row.len[r]) + n;

   /*  compute L VectorBase<R> entry and
    *  and remove pivot column form row file
    */

   for(j = m; u.row.idx[j] != pcol; --j)
      ;

   lx = u.row.val[j] / pval;

   l.val[lv] = lx;

   l.idx[lv] = r;

   ++lv;

   u.row.idx[j] = u.row.idx[m];

   u.row.val[j] = u.row.val[m];


   /*  update loop (I) and
    *  computing expected fill
    */
   fill = u.row.len[prow];

   for(j = m - 1; j >= n; --j)
   {
      c = u.row.idx[j];

      if(temp.s_mark[c])
      {
         /*  count fill elements.
          */
         temp.s_mark[c] = 0;
         --fill;

         /*  update row values
          */
         x = u.row.val[j] -= work[c] * lx;

         if(isZero(x, eps))
         {
            /* Eliminate zero from row r
             */
            --u.row.len[r];
            --m;
            u.row.val[j] = u.row.val[m];
            u.row.idx[j] = u.row.idx[m];

            /* Eliminate zero from column c
             */
            --(temp.s_cact[c]);
            k = --(u.col.len[c]) + u.col.start[c];

            for(i = k; u.col.idx[i] != r; --i)
               ;

            u.col.idx[i] = u.col.idx[k];
         }
      }
   }


   /*  create space for fill in row file
    */
   ll = u.row.len[r];

   if(ll + fill > u.row.max[r])
      remaxRow(r, ll + fill);

   ll += u.row.start[r];

   /*  fill creating update loop (II)
    */
   for(j = u.row.start[prow], m = j + u.row.len[prow]; j < m; ++j)
   {
      c = u.row.idx[j];

      if(temp.s_mark[c])
      {
         x = - work[c] * lx;

         if(isNotZero(x, eps))
         {
            /* produce fill element in row r
             */
            u.row.val[ll] = x;
            u.row.idx[ll] = c;
            ll++;
            u.row.len[r]++;

            /* produce fill element in column c
             */

            if(u.col.len[c] >= u.col.max[c])
               remaxCol(c, u.col.len[c] + 1);

            u.col.idx[u.col.start[c] + (u.col.len[c])++] = r;

            temp.s_cact[c]++;
         }
      }
      else
         temp.s_mark[c] = 1;
   }

   /*  move row to appropriate list.
    */
   removeDR(temp.pivot_row[r]);

   init2DR(temp.pivot_row[r], temp.pivot_rowNZ[u.row.len[r]]);

   assert(row.perm[r] < 0);

   temp.s_max[r] = -1;

   return lv;
}